

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitAtomicWait(Replacer *this,AtomicWait *curr)

{
  char *pcVar1;
  Index bytes;
  BasicType BVar2;
  Expression *pEVar3;
  
  BVar2 = wasm::Type::getBasic(&curr->expectedType);
  if (BVar2 == i32) {
    bytes = 4;
  }
  else {
    if (BVar2 != i64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp"
                         ,0x170);
    }
    bytes = 8;
  }
  pEVar3 = getPtr<wasm::AtomicWait>(this,curr,bytes);
  curr->ptr = pEVar3;
  pcVar1 = (this->parent->combinedMemory).super_IString.str._M_str;
  (curr->memory).super_IString.str._M_len = (this->parent->combinedMemory).super_IString.str._M_len;
  (curr->memory).super_IString.str._M_str = pcVar1;
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
      Index bytes;
      switch (curr->expectedType.getBasic()) {
        case Type::i32: {
          bytes = 4;
          break;
        }
        case Type::i64: {
          bytes = 8;
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected type");
      }
      curr->ptr = getPtr(curr, bytes);
      setMemory(curr);
    }